

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::set_config(raft_server *this,ptr<cluster_config> *new_config)

{
  shared_ptr<nuraft::cluster_config> *in_RDI;
  lock_guard<std::mutex> l;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffd8);
  std::shared_ptr<nuraft::cluster_config>::operator=
            (in_RDI,(shared_ptr<nuraft::cluster_config> *)in_stack_ffffffffffffffd8);
  std::shared_ptr<nuraft::cluster_config>::operator=
            (in_RDI,(shared_ptr<nuraft::cluster_config> *)in_stack_ffffffffffffffd8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2284e4);
  return;
}

Assistant:

void raft_server::set_config(const ptr<cluster_config>& new_config) {
    std::lock_guard<std::mutex> l(config_lock_);
    stale_config_ = config_;
    config_ = new_config;
}